

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O1

int arkStep_RelaxDeltaE(ARKodeMem ark_mem,ARKRelaxJacFn relax_jac_fn,long *num_relax_jac_evals,
                       sunrealtype *delta_e_out)

{
  long lVar1;
  void *pvVar2;
  N_Vector p_Var3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  int iVar6;
  N_Vector p_Var7;
  N_Vector p_Var8;
  long lVar9;
  long lVar10;
  long lVar11;
  double dVar12;
  double dVar13;
  
  pvVar2 = ark_mem->step_mem;
  if (pvVar2 == (void *)0x0) {
    iVar6 = -0x15;
    arkProcessError(ark_mem,-0x15,0xd76,"arkStep_RelaxDeltaE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_arkstep.c"
                    ,"Time step module memory is NULL.");
  }
  else {
    p_Var3 = ark_mem->tempv3;
    p_Var7 = ark_mem->tempv2;
    *delta_e_out = 0.0;
    if (0 < *(int *)((long)pvVar2 + 100)) {
      puVar4 = *(undefined8 **)((long)pvVar2 + 0x1a8);
      puVar5 = *(undefined8 **)((long)pvVar2 + 0x1b0);
      lVar11 = 0;
      lVar10 = 0;
      do {
        if ((*(int *)((long)pvVar2 + 0x20) == 0) && (*(int *)((long)pvVar2 + 0x178) != 1)) {
          *puVar4 = 0x3ff0000000000000;
          *puVar5 = ark_mem->yn;
          if (lVar10 == 0) {
            lVar9 = 1;
          }
          else {
            lVar9 = 1;
            do {
              puVar4[lVar9] =
                   ark_mem->h *
                   *(double *)
                    (*(long *)(*(long *)(*(long *)((long)pvVar2 + 0x68) + 0x10) + lVar10 * 8) + -8 +
                    lVar9 * 8);
              puVar5[lVar9] = *(undefined8 *)(*(long *)((long)pvVar2 + 0x28) + -8 + lVar9 * 8);
              lVar1 = lVar11 + lVar9;
              lVar9 = lVar9 + 1;
            } while (lVar1 != 0);
          }
          iVar6 = N_VLinearCombination(lVar9,puVar4,puVar5,p_Var7);
          if (iVar6 != 0) {
            return -0x1c;
          }
        }
        else {
          p_Var7 = *(N_Vector *)(*(long *)((long)pvVar2 + 0x38) + lVar10 * 8);
        }
        iVar6 = (*relax_jac_fn)(p_Var7,p_Var3,ark_mem->user_data);
        *num_relax_jac_evals = *num_relax_jac_evals + 1;
        if (iVar6 < 0) {
          return -0x2e;
        }
        if (iVar6 != 0) {
          return 2;
        }
        p_Var8 = p_Var7;
        if (*(int *)((long)pvVar2 + 0x1c) == 0) {
LAB_001219ac:
          if (*(int *)((long)pvVar2 + 0x178) == 1) {
            N_VScale(0x3ff0000000000000,*(undefined8 *)(*(long *)((long)pvVar2 + 0x30) + lVar10 * 8)
                     ,p_Var7);
          }
          else {
            p_Var8 = *(N_Vector *)(*(long *)((long)pvVar2 + 0x30) + lVar10 * 8);
          }
          lVar9 = *(long *)((long)pvVar2 + 0x70);
LAB_00121a70:
          dVar12 = *(double *)(*(long *)(lVar9 + 0x20) + lVar10 * 8);
        }
        else {
          if (*(int *)((long)pvVar2 + 0x20) == 0) {
            if (*(int *)((long)pvVar2 + 0x1c) == 0) goto LAB_001219ac;
            if (*(int *)((long)pvVar2 + 0x178) == 1) {
              N_VScale(0x3ff0000000000000,
                       *(undefined8 *)(*(long *)((long)pvVar2 + 0x28) + lVar10 * 8),p_Var7);
            }
            else {
              p_Var8 = *(N_Vector *)(*(long *)((long)pvVar2 + 0x28) + lVar10 * 8);
            }
            lVar9 = *(long *)((long)pvVar2 + 0x68);
            goto LAB_00121a70;
          }
          N_VLinearSum(*(undefined8 *)
                        (*(long *)(*(long *)((long)pvVar2 + 0x68) + 0x20) + lVar10 * 8),
                       *(undefined8 *)
                        (*(long *)(*(long *)((long)pvVar2 + 0x70) + 0x20) + lVar10 * 8),
                       *(undefined8 *)(*(long *)((long)pvVar2 + 0x28) + lVar10 * 8),
                       *(undefined8 *)(*(long *)((long)pvVar2 + 0x30) + lVar10 * 8),p_Var7);
          dVar12 = 1.0;
        }
        if ((*(int *)((long)pvVar2 + 0x178) == 1) &&
           (iVar6 = (**(code **)((long)pvVar2 + 0x160))
                              (*(undefined8 *)((long)pvVar2 + 0xe8),ark_mem,p_Var8), iVar6 != 0)) {
          return -0x10;
        }
        if ((p_Var3->ops->nvdotprodlocal == (_func_sunrealtype_N_Vector_N_Vector *)0x0) ||
           (p_Var3->ops->nvdotprodmultiallreduce ==
            (_func_SUNErrCode_int_N_Vector_sunrealtype_ptr *)0x0)) {
          dVar13 = (double)N_VDotProd(p_Var3,p_Var8);
        }
        else {
          dVar13 = (double)N_VDotProdLocal(p_Var3,p_Var8);
        }
        *delta_e_out = dVar12 * dVar13 + *delta_e_out;
        lVar10 = lVar10 + 1;
        lVar11 = lVar11 + -1;
      } while (lVar10 < *(int *)((long)pvVar2 + 100));
    }
    if (((p_Var3->ops->nvdotprodlocal != (_func_sunrealtype_N_Vector_N_Vector *)0x0) &&
        (p_Var3->ops->nvdotprodmultiallreduce !=
         (_func_SUNErrCode_int_N_Vector_sunrealtype_ptr *)0x0)) &&
       (iVar6 = N_VDotProdMultiAllReduce(1,p_Var3,delta_e_out), iVar6 != 0)) {
      return -0x1c;
    }
    *delta_e_out = ark_mem->h * *delta_e_out;
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

int arkStep_RelaxDeltaE(ARKodeMem ark_mem, ARKRelaxJacFn relax_jac_fn,
                        long int* num_relax_jac_evals, sunrealtype* delta_e_out)
{
  int i, j, nvec, retval;
  sunrealtype* cvals;
  N_Vector* Xvecs;
  ARKodeARKStepMem step_mem;
  N_Vector z_stage = ark_mem->tempv2;
  N_Vector J_relax = ark_mem->tempv3;
  N_Vector rhs_tmp = NULL;
  sunrealtype bi   = ONE;

  /* Access the stepper memory structure */
  if (!(ark_mem->step_mem))
  {
    arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARKSTEP_NO_MEM);
    return ARK_MEM_NULL;
  }
  step_mem = (ARKodeARKStepMem)(ark_mem->step_mem);

  /* Initialize output */
  *delta_e_out = ZERO;

  /* Set arrays for fused vector operation */
  cvals = step_mem->cvals;
  Xvecs = step_mem->Xvecs;

  for (i = 0; i < step_mem->stages; i++)
  {
    if (step_mem->implicit || step_mem->mass_type == MASS_FIXED)
    {
      /* Use stored stages */
      z_stage = step_mem->z[i];
    }
    else
    {
      /* Reconstruct explicit stages */
      nvec = 0;

      cvals[nvec] = ONE;
      Xvecs[nvec] = ark_mem->yn;
      nvec++;

      for (j = 0; j < i; j++)
      {
        cvals[nvec] = ark_mem->h * step_mem->Be->A[i][j];
        Xvecs[nvec] = step_mem->Fe[j];
        nvec++;
      }

      retval = N_VLinearCombination(nvec, cvals, Xvecs, z_stage);
      if (retval) { return ARK_VECTOROP_ERR; }
    }

    /* Evaluate the Jacobian at z_i */
    retval = relax_jac_fn(z_stage, J_relax, ark_mem->user_data);
    (*num_relax_jac_evals)++;
    if (retval < 0) { return ARK_RELAX_JAC_FAIL; }
    if (retval > 0) { return ARK_RELAX_JAC_RECV; }

    /* Reset temporary RHS alias */
    rhs_tmp = z_stage;

    /* Compute delta_e = h * sum_i b_i * <relax_jac(z_i), f_i> */
    if (step_mem->explicit && step_mem->implicit)
    {
      N_VLinearSum(step_mem->Be->b[i], step_mem->Fe[i], step_mem->Bi->b[i],
                   step_mem->Fi[i], rhs_tmp);
      bi = ONE;
    }
    else if (step_mem->explicit)
    {
      if (step_mem->mass_type == MASS_FIXED)
      {
        N_VScale(ONE, step_mem->Fe[i], rhs_tmp);
      }
      else { rhs_tmp = step_mem->Fe[i]; }
      bi = step_mem->Be->b[i];
    }
    else
    {
      if (step_mem->mass_type == MASS_FIXED)
      {
        N_VScale(ONE, step_mem->Fi[i], rhs_tmp);
      }
      else { rhs_tmp = step_mem->Fi[i]; }
      bi = step_mem->Bi->b[i];
    }

    if (step_mem->mass_type == MASS_FIXED)
    {
      retval = step_mem->msolve((void*)ark_mem, rhs_tmp, step_mem->nlscoef);
      if (retval) { return ARK_MASSSOLVE_FAIL; }
    }

    /* Update estimate of relaxation function change */
    if (J_relax->ops->nvdotprodlocal && J_relax->ops->nvdotprodmultiallreduce)
    {
      *delta_e_out += bi * N_VDotProdLocal(J_relax, rhs_tmp);
    }
    else { *delta_e_out += bi * N_VDotProd(J_relax, rhs_tmp); }
  }

  if (J_relax->ops->nvdotprodlocal && J_relax->ops->nvdotprodmultiallreduce)
  {
    retval = N_VDotProdMultiAllReduce(1, J_relax, delta_e_out);
    if (retval) { return ARK_VECTOROP_ERR; }
  }

  *delta_e_out *= ark_mem->h;

  return ARK_SUCCESS;
}